

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrUtil.c
# Opt level: O3

int Pdr_NtkFindSatAssign_rec(Aig_Man_t *pAig,Aig_Obj_t *pNode,int Value,Pdr_Set_t *pCube,int Heur)

{
  Aig_Obj_t **ppAVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Aig_Obj_t *pAVar7;
  Aig_Obj_t *pAVar8;
  bool bVar9;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aig.h"
                  ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
  }
  do {
    uVar6 = (uint)*(ulong *)&pNode->field_0x18;
    bVar9 = true;
    if ((uVar6 & 7) == 1) {
LAB_006003f2:
      return (int)bVar9;
    }
    if (pNode->TravId == pAig->nTravIds) {
      bVar9 = (uVar6 >> 4 & 1) == Value;
      goto LAB_006003f2;
    }
    pNode->TravId = pAig->nTravIds;
    *(ulong *)&pNode->field_0x18 =
         *(ulong *)&pNode->field_0x18 & 0xffffffffffffffef | (ulong)((Value & 1U) << 4);
    if ((uVar6 & 7) == 2) {
      iVar4 = (pNode->field_0).CioId - pAig->nTruePis;
      if (pAig->nTruePis <= (pNode->field_0).CioId) {
        if ((1 < (uint)Value) || (iVar4 < 0)) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12e,"int Abc_Var2Lit(int, int)");
        }
        iVar3 = pCube->nLits;
        pCube->nLits = iVar3 + 1;
        *(int *)(&pCube->field_0x14 + (long)iVar3 * 4) = Value + iVar4 * 2;
        iVar4 = (&pCube->nLits)[pCube->nLits];
        pCube->Sign = pCube->Sign |
                      1L << (((char)(uint)((ulong)((long)iVar4 * 0x82082083) >> 0x25) -
                             (char)(iVar4 >> 0x1f)) * -0x3f + (char)iVar4 & 0x3fU);
      }
      goto LAB_006003f2;
    }
    if ((uVar6 & 7) - 7 < 0xfffffffe) {
      __assert_fail("Aig_ObjIsNode(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrUtil.c"
                    ,0x2fc,
                    "int Pdr_NtkFindSatAssign_rec(Aig_Man_t *, Aig_Obj_t *, int, Pdr_Set_t *, int)")
      ;
    }
    pAVar7 = (Aig_Obj_t *)((ulong)pNode->pFanin0 & 0xfffffffffffffffe);
    uVar6 = (uint)pNode->pFanin0 & 1;
    if (Value == 0) {
      iVar4 = pAig->nTravIds;
      if (pAVar7->TravId == iVar4) {
        if ((*(uint *)&pAVar7->field_0x18 >> 4 & 1) == uVar6) goto LAB_006003f2;
        pAVar7 = (Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
        Value = (uint)pNode->pFanin1 & 1;
        pNode = pAVar7;
        if (pAVar7->TravId == iVar4) {
          bVar9 = (*(uint *)&pAVar7->field_0x18 >> 4 & 1) == Value;
          goto LAB_006003f2;
        }
      }
      else {
        pAVar8 = (Aig_Obj_t *)((ulong)pNode->pFanin1 & 0xfffffffffffffffe);
        uVar5 = (uint)pNode->pFanin1 & 1;
        Value = uVar6;
        if (pAVar8->TravId == iVar4) {
          uVar6 = *(uint *)&pAVar8->field_0x18 >> 4 & 1;
          bVar9 = uVar6 == uVar5;
          if ((pAVar7->TravId == iVar4) || (pNode = pAVar7, uVar6 == uVar5)) goto LAB_006003f2;
        }
        else {
          piVar2 = &pNode->Id;
          pNode = pAVar7;
          if (*piVar2 % 4 == Heur) {
            pNode = pAVar8;
            Value = uVar5;
          }
        }
      }
    }
    else {
      iVar4 = Pdr_NtkFindSatAssign_rec(pAig,pAVar7,uVar6 ^ 1,pCube,Heur);
      if (iVar4 == 0) {
        bVar9 = false;
        goto LAB_006003f2;
      }
      ppAVar1 = &pNode->pFanin1;
      pNode = (Aig_Obj_t *)((ulong)*ppAVar1 & 0xfffffffffffffffe);
      Value = ~(uint)*ppAVar1 & 1;
    }
  } while( true );
}

Assistant:

int Pdr_NtkFindSatAssign_rec( Aig_Man_t * pAig, Aig_Obj_t * pNode, int Value, Pdr_Set_t * pCube, int Heur )
{
    int Value0, Value1;
    if ( Aig_ObjIsConst1(pNode) )
        return 1;
    if ( Aig_ObjIsTravIdCurrent(pAig, pNode) )
        return ((int)pNode->fMarkA == Value);
    Aig_ObjSetTravIdCurrent(pAig, pNode);
    pNode->fMarkA = Value;
    if ( Aig_ObjIsCi(pNode) )
    {
        if ( Saig_ObjIsLo(pAig, pNode) )
        {
//            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), !Value );
            pCube->Lits[pCube->nLits++] = Abc_Var2Lit( Aig_ObjCioId(pNode) - Saig_ManPiNum(pAig), Value );
            pCube->Sign |= ((word)1 << (pCube->Lits[pCube->nLits-1] % 63));
        }
        return 1;
    }
    assert( Aig_ObjIsNode(pNode) );
    // propagation
    if ( Value ) 
    {
        if ( !Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), !Aig_ObjFaninC0(pNode), pCube, Heur) )
            return 0;
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), !Aig_ObjFaninC1(pNode), pCube, Heur);
    }
    // justification
    Value0 = Pdr_ObjSatValue( pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode) );
    if ( Value0 == PDR_VAL0 )
        return 1;
    Value1 = Pdr_ObjSatValue( pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode) );
    if ( Value1 == PDR_VAL0 )
        return 1;
    if ( Value0 == PDR_VAL1 && Value1 == PDR_VAL1 )
        return 0;
    if ( Value0 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    if ( Value1 == PDR_VAL1 )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
    assert( Value0 == PDR_VALX && Value1 == PDR_VALX );
    // decision making
//    if ( rand() % 10 == Heur )
    if ( Aig_ObjId(pNode) % 4 == Heur )
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin1(pNode), Aig_ObjFaninC1(pNode), pCube, Heur);
    else
        return Pdr_NtkFindSatAssign_rec(pAig, Aig_ObjFanin0(pNode), Aig_ObjFaninC0(pNode), pCube, Heur);
}